

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedTest.cpp
# Opt level: O0

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::NamedTest::result(NamedTest *this)

{
  element_type *peVar1;
  long in_RSI;
  unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> local_28;
  unique_ptr<oout::NamedResult,_std::default_delete<oout::NamedResult>_> local_20 [2];
  NamedTest *this_local;
  
  this_local = this;
  peVar1 = std::__shared_ptr_access<const_oout::Test,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_oout::Test,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(in_RSI + 0x28));
  (*peVar1->_vptr_Test[2])();
  std::
  make_unique<oout::NamedResult,std::__cxx11::string_const&,std::unique_ptr<oout::Result_const,std::default_delete<oout::Result_const>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20,
             (unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> *)
             (in_RSI + 8));
  std::unique_ptr<oout::Result_const,std::default_delete<oout::Result_const>>::
  unique_ptr<oout::NamedResult,std::default_delete<oout::NamedResult>,void>
            ((unique_ptr<oout::Result_const,std::default_delete<oout::Result_const>> *)this,local_20
            );
  std::unique_ptr<oout::NamedResult,_std::default_delete<oout::NamedResult>_>::~unique_ptr(local_20)
  ;
  std::unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_>::~unique_ptr
            (&local_28);
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> NamedTest::result() const
{
	return make_unique<NamedResult>(name, test->result());
}